

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O2

Queue * lex_line(Source_File *src,Translation_Data *translation_data,char lex_defined_token)

{
  char cVar1;
  char cVar2;
  Queue *q;
  token *__ptr;
  token *ptVar3;
  void *pvVar4;
  char *pcVar5;
  long lVar6;
  Source_File *pSVar7;
  Source_File *pSVar8;
  byte bVar9;
  Source_File temp_src;
  
  bVar9 = 0;
  q = (Queue *)malloc(0x18);
  Queue_Init(q);
  pSVar7 = src;
  pSVar8 = &temp_src;
  for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
    pSVar8->src_name = pSVar7->src_name;
    pSVar7 = (Source_File *)((long)pSVar7 + (ulong)bVar9 * -0x10 + 8);
    pSVar8 = (Source_File *)((long)pSVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  goto_new_line(src,translation_data);
  cVar1 = src->src[src->where_in_src];
  src->src[src->where_in_src] = '\0';
  translation_data->tokens = q;
  do {
    __ptr = get_next_token(&temp_src,chonky,'\0');
    if (__ptr->type == KW_NOTYPE) {
      free(__ptr);
      src->src[src->where_in_src] = cVar1;
      return q;
    }
    if ((__ptr->type == KW_ID && lex_defined_token != '\0') && (__ptr->data_size == 7)) {
      cVar2 = gstrn_cmp(__ptr->data,"defined",7);
      if (cVar2 != '\0') {
        free(__ptr);
        __ptr = get_next_token(&temp_src,chonky,'\0');
        if (__ptr->type == KW_ID) {
LAB_00146fd3:
          pvVar4 = Map_Check(translation_data->macros,__ptr->data,__ptr->data_size);
          __ptr->type = KW_DECIMAL_CONSTANT;
          if (pvVar4 == (void *)0x0) {
            pcVar5 = "0";
          }
          else {
            pcVar5 = "1";
          }
          __ptr->data = pcVar5;
          __ptr->data_size = 1;
        }
        else {
          if (__ptr->type == KW_OPEN_NORMAL) {
            free(__ptr);
            __ptr = get_next_token(&temp_src,chonky,'\0');
            if (__ptr->type == KW_ID) {
              ptVar3 = get_next_token(&temp_src,chonky,'\0');
              if (ptVar3->type == KW_CLOSE_NORMAL) goto LAB_00146fd3;
              pcVar5 = "expected an \')\' after id in define";
            }
            else {
              pcVar5 = "expected an id after \'(\' in defined";
            }
          }
          else {
            pcVar5 = "expected an id after define";
          }
          push_lexing_error(pcVar5,src,translation_data);
        }
      }
    }
    Queue_Push(q,__ptr);
  } while( true );
}

Assistant:

struct Queue* lex_line(struct Source_File *src,struct Translation_Data *translation_data,char lex_defined_token)
{

	struct Source_File temp_src;
	struct token *hold_token;
	struct Queue *tokens;
	char just_in_case;

	tokens=malloc(sizeof(struct Queue));
	Queue_Init(tokens);


	temp_src=*src;
	goto_new_line(src,translation_data);
	just_in_case=src->src[src->where_in_src];
	src->src[src->where_in_src]='\0';

	translation_data->tokens=tokens;
	
	while((hold_token=get_next_token(&temp_src,&chonky[0],0))->type!=KW_NOTYPE)
	{
		if(lex_defined_token && hold_token->type==KW_ID && hold_token->data_size==7 && gstrn_cmp(hold_token->data,"defined",7))
		{
			free(hold_token);
			hold_token=get_next_token(&temp_src,&chonky[0],0);
			if(hold_token->type==KW_OPEN_NORMAL)
			{
				free(hold_token);
				hold_token=get_next_token(&temp_src,&chonky[0],0);
				if(hold_token->type!=KW_ID)
				{
					push_lexing_error("expected an id after '(' in defined",src,translation_data);
				}else
				{
					struct token *hold_closing_token;
					hold_closing_token=get_next_token(&temp_src,&chonky[0],0);
					if(hold_closing_token->type!=KW_CLOSE_NORMAL)
					{
						push_lexing_error("expected an ')' after id in define",src,translation_data);
					}else
					{
						if(!Map_Check(translation_data->macros,hold_token->data,hold_token->data_size))
						{
							hold_token->type=KW_DECIMAL_CONSTANT;
							hold_token->data="0";
							hold_token->data_size=1;
						}else
						{
							hold_token->type=KW_DECIMAL_CONSTANT;
							hold_token->data="1";
							hold_token->data_size=1;
						}

					}
				}
			}else if(hold_token->type!=KW_ID)
			{
				push_lexing_error("expected an id after define",src,translation_data);
			}else
			{
				if(!Map_Check(translation_data->macros,hold_token->data,hold_token->data_size))
				{
					hold_token->type=KW_DECIMAL_CONSTANT;
					hold_token->data="0";
					hold_token->data_size=1;
				}else
				{
					hold_token->type=KW_DECIMAL_CONSTANT;
					hold_token->data="1";
					hold_token->data_size=1;
				}
			}
		}
		Queue_Push(tokens,hold_token);
	}

	free(hold_token);
	src->src[src->where_in_src]=just_in_case;

	return tokens;
}